

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O0

void duckdb::CreateSortKeyInternal
               (vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
                *sort_key_data,vector<duckdb::OrderModifiers,_true> *modifiers,Vector *result,
               idx_t row_count)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  SortKeyConstructInfo *info_00;
  size_type sVar4;
  const_reference pvVar5;
  pointer result_data;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  size_type in_RDX;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  *in_RDI;
  SortKeyConstructInfo info;
  idx_t c;
  unsafe_vector<idx_t> offsets;
  unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>,_true> data_pointers;
  unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
  *vector_data;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
  *__range1;
  SortKeyLengthInfo key_lengths;
  type in_stack_fffffffffffffee8;
  vector<duckdb::OrderModifiers,_true> *in_stack_fffffffffffffef0;
  idx_t in_stack_ffffffffffffff08;
  SortKeyLengthInfo *in_stack_ffffffffffffff10;
  value_type_conflict1 *__x;
  type in_stack_ffffffffffffff30;
  undefined6 in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff3e;
  value_type modifiers_p;
  SortKeyVectorData *in_stack_ffffffffffffff40;
  unsafe_vector<idx_t> *in_stack_ffffffffffffff48;
  Vector *in_stack_ffffffffffffff50;
  ulong local_a0;
  data_ptr_t *in_stack_ffffffffffffff68;
  SortKeyLengthInfo *in_stack_ffffffffffffff70;
  pointer in_stack_ffffffffffffff78;
  Vector *in_stack_ffffffffffffff80;
  value_type_conflict1 local_78 [3];
  reference local_60;
  unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
  *local_58;
  __normal_iterator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>_>
  local_50;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  *local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  size_type local_18;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  SortKeyLengthInfo::SortKeyLengthInfo(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  local_48 = local_8;
  local_50._M_current =
       (unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
        *)::std::
          vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
          ::begin((vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                   *)in_stack_fffffffffffffee8);
  local_58 = (unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
              *)::std::
                vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                ::end((vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                       *)in_stack_fffffffffffffee8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>_>
                        *)in_stack_fffffffffffffee8);
    if (!bVar2) break;
    local_60 = __gnu_cxx::
               __normal_iterator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>_>
               ::operator*(&local_50);
    in_stack_ffffffffffffff30 =
         unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
         ::operator*((unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
                      *)in_stack_fffffffffffffef0);
    GetSortKeyLength(in_stack_ffffffffffffff40,
                     (SortKeyLengthInfo *)
                     CONCAT26(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38));
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>_>
    ::operator++(&local_50);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_20;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  info_00 = (SortKeyConstructInfo *)operator_new__(uVar3);
  __x = local_78;
  unique_ptr<unsigned_char*[],std::default_delete<unsigned_char*[]>,true>::
  unique_ptr<unsigned_char**,std::default_delete<unsigned_char*[]>,void,bool>
            ((unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>,_true> *)
             in_stack_fffffffffffffef0,(uchar **)in_stack_fffffffffffffee8);
  ::std::unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>::get
            ((unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_> *)
             in_stack_fffffffffffffef0);
  PrepareSortData(in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78,
                  in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  vector<unsigned_long,_false>::vector((vector<unsigned_long,_false> *)0x13e86db);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_20,local_18,__x);
  local_a0 = 0;
  while( true ) {
    sVar4 = ::std::
            vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
            ::size(local_8);
    if (sVar4 <= local_a0) break;
    pvVar5 = vector<duckdb::OrderModifiers,_true>::operator[]
                       (in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
    modifiers_p = *pvVar5;
    result_data = ::std::unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>::get
                            ((unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>
                              *)in_stack_fffffffffffffef0);
    SortKeyConstructInfo::SortKeyConstructInfo
              ((SortKeyConstructInfo *)&stack0xffffffffffffff40,modifiers_p,
               (unsafe_vector<idx_t> *)&stack0xffffffffffffff70,result_data);
    in_stack_fffffffffffffef0 =
         (vector<duckdb::OrderModifiers,_true> *)
         vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
         ::operator[]((vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
                       *)in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8);
    in_stack_fffffffffffffee8 =
         unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
         ::operator*((unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
                      *)in_stack_fffffffffffffef0);
    ConstructSortKey(in_stack_ffffffffffffff30,info_00);
    local_a0 = local_a0 + 1;
  }
  FinalizeSortData(in_stack_ffffffffffffff50,(idx_t)in_stack_ffffffffffffff48);
  vector<unsigned_long,_false>::~vector((vector<unsigned_long,_false> *)0x13e882e);
  unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>,_true>::~unique_ptr
            ((unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>,_true> *)
             0x13e883b);
  SortKeyLengthInfo::~SortKeyLengthInfo((SortKeyLengthInfo *)0x13e8848);
  return;
}

Assistant:

static void CreateSortKeyInternal(vector<unique_ptr<SortKeyVectorData>> &sort_key_data,
                                  const vector<OrderModifiers> &modifiers, Vector &result, idx_t row_count) {
	// two phases
	// a) get the length of the final sorted key
	// b) allocate the sorted key and construct
	// we do all of this in a vectorized manner
	SortKeyLengthInfo key_lengths(row_count);
	for (auto &vector_data : sort_key_data) {
		GetSortKeyLength(*vector_data, key_lengths);
	}
	// allocate the empty sort keys
	auto data_pointers = unique_ptr<data_ptr_t[]>(new data_ptr_t[row_count]);
	PrepareSortData(result, row_count, key_lengths, data_pointers.get());

	unsafe_vector<idx_t> offsets;
	offsets.resize(row_count, 0);
	// now construct the sort keys
	for (idx_t c = 0; c < sort_key_data.size(); c++) {
		SortKeyConstructInfo info(modifiers[c], offsets, data_pointers.get());
		ConstructSortKey(*sort_key_data[c], info);
	}
	FinalizeSortData(result, row_count);
}